

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void cmCacheManager::OutputValue(ostream *fout,string *value)

{
  char cVar1;
  ostream *poVar2;
  
  if ((value->_M_string_length != 0) &&
     ((cVar1 = (value->_M_dataplus)._M_p[value->_M_string_length - 1], cVar1 == ' ' ||
      (cVar1 == '\t')))) {
    poVar2 = std::operator<<(fout,'\'');
    poVar2 = std::operator<<(poVar2,(string *)value);
    std::operator<<(poVar2,'\'');
    return;
  }
  std::operator<<(fout,(string *)value);
  return;
}

Assistant:

void cmCacheManager::OutputValue(std::ostream& fout, std::string const& value)
{
  // if value has trailing space or tab, enclose it in single quotes
  if (!value.empty() &&
      (value[value.size() - 1] == ' ' ||
       value[value.size() - 1] == '\t'))
    {
    fout << '\'' << value << '\'';
    }
  else
    {
    fout << value;
    }
}